

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalize_fake_var_array.hpp
# Opt level: O0

void __thiscall
front::optimization::scalize_fake_var_array::ScalizeFakeVarArray::optimize_functiom
          (ScalizeFakeVarArray *this,string *funcName,MirPackage *package,
          BmirVariableTable *bmirVariableTable,
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          *insts)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  pointer pvVar4;
  char *pcVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  element_type *peVar13;
  AssignInst *in_RCX;
  int __c;
  int __c_00;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  **__s;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *in_R8;
  OpInst *opInst;
  size_t index_1;
  size_t index;
  VarId *src;
  LoadInst *loadInst;
  string *varName;
  RefInst *refInst;
  shared_ptr<mir::inst::Inst> mirInst;
  iterator instructionIter;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tmpVarId2VarSingleName;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  tmpVarId2Offset;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  BmirVariableTable *in_stack_fffffffffffffb20;
  const_iterator in_stack_fffffffffffffb28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffffb30;
  const_iterator in_stack_fffffffffffffb38;
  iterator in_stack_fffffffffffffb50;
  VarId *in_stack_fffffffffffffb58;
  AssignInst *in_stack_fffffffffffffb60;
  byte local_3da;
  byte local_3aa;
  string local_328 [120];
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_2b0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_2a8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_298;
  difference_type local_290;
  uint32_t local_284;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_280;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_278;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_270;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_268;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_258;
  undefined1 local_249;
  uint32_t local_248;
  uint32_t local_244;
  string local_240 [120];
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_1c8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_1c0;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_1b0;
  difference_type local_1a8;
  uint32_t local_19c;
  VarId *local_198;
  element_type *local_190;
  uint32_t local_188;
  byte local_181;
  string local_180 [32];
  string local_160 [32];
  uint32_t local_140;
  undefined4 local_13c;
  byte local_109;
  string local_108 [32];
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  element_type *local_c0;
  __shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2> local_a8;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_98;
  __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
  local_90 [13];
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *local_28;
  AssignInst *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  std::
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::map((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
         *)0x1bdddc);
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1bdde9);
  local_90[0]._M_current =
       (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
        *)std::
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  while( true ) {
    local_98 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                *)std::
                  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                  ::end((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    __s = &local_98;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    if (!bVar2) break;
    pvVar4 = __gnu_cxx::
             __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
             ::operator->(local_90);
    pcVar5 = std::
             variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
             ::index(pvVar4,(char *)__s,__c);
    if (pcVar5 == (char *)0x0) {
      __gnu_cxx::
      __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
      ::operator*(local_90);
      std::
      get<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                  *)0x1bde65);
      std::shared_ptr<mir::inst::Inst>::shared_ptr
                ((shared_ptr<mir::inst::Inst> *)in_stack_fffffffffffffb20,
                 (shared_ptr<mir::inst::Inst> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      peVar6 = std::__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bde99);
      iVar3 = (*(peVar6->super_Displayable)._vptr_Displayable[1])();
      if (iVar3 == 1) {
        peVar13 = std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::get(&local_a8);
        mir::inst::VarId::operator_cast_to_unsigned_int(&peVar13->dest);
        in_stack_fffffffffffffb30 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                ::count((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                         *)in_stack_fffffffffffffb30,
                        (key_type_conflict *)in_stack_fffffffffffffb28._M_current);
        if (in_stack_fffffffffffffb30 !=
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x0) {
          bVar2 = std::holds_alternative<int,int,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)0x1beb09);
          if (bVar2) {
            in_stack_fffffffffffffb28._M_current =
                 (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                  *)std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x1beb20);
            in_stack_fffffffffffffb1c = *(int *)in_stack_fffffffffffffb28._M_current;
            mir::inst::VarId::operator_cast_to_unsigned_int(&peVar13->dest);
            in_stack_fffffffffffffb20 =
                 (BmirVariableTable *)
                 std::
                 map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                               *)in_stack_fffffffffffffb60,
                              (key_type_conflict *)in_stack_fffffffffffffb58);
            *(int *)&(in_stack_fffffffffffffb20->name2VarArray)._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right =
                 in_stack_fffffffffffffb1c +
                 *(int *)&(in_stack_fffffffffffffb20->name2VarArray)._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_right;
          }
          else {
            mir::inst::VarId::operator_cast_to_unsigned_int(&peVar13->dest);
            std::
            map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::erase((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffffb20,
                    (key_type_conflict *)
                    CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          }
        }
      }
      else if (iVar3 == 2) {
        local_c0 = std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::get(&local_a8);
        bVar2 = std::holds_alternative<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                          ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x1bdf3b);
        if (bVar2) {
          local_c8 = std::get<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                               ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)0x1bdf55);
          local_109 = 0;
          std::__cxx11::string::string(local_e8,(string *)local_c8);
          bVar2 = bmir_variable_table::BmirVariableTable::hasNameKey
                            (in_stack_fffffffffffffb20,
                             (string *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)
                            );
          local_3aa = 0;
          if (bVar2) {
            std::__cxx11::string::string(local_108,(string *)local_c8);
            local_109 = 1;
            bmir_variable_table::BmirVariableTable::getVarArray
                      (in_stack_fffffffffffffb20,
                       (string *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            peVar7 = std::
                     __shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1be02e);
            local_3aa = peVar7->changed ^ 0xff;
          }
          if ((local_109 & 1) != 0) {
            std::__cxx11::string::~string(local_108);
          }
          std::__cxx11::string::~string(local_e8);
          if ((local_3aa & 1) == 0) {
            local_181 = 0;
            std::__cxx11::string::string(local_160,(string *)local_c8);
            bVar2 = bmir_variable_table::BmirVariableTable::hasVarSingle
                              (in_stack_fffffffffffffb20,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            local_3da = 0;
            if (bVar2) {
              std::__cxx11::string::string(local_180,(string *)local_c8);
              local_181 = 1;
              bmir_variable_table::BmirVariableTable::getVarSingle
                        (in_stack_fffffffffffffb20,
                         (string *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
              peVar8 = std::
                       __shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1be241);
              local_3da = peVar8->changed ^ 0xff;
            }
            if ((local_181 & 1) != 0) {
              std::__cxx11::string::~string(local_180);
            }
            std::__cxx11::string::~string(local_160);
            pbVar1 = local_c8;
            if ((local_3da & 1) != 0) {
              local_188 = mir::inst::VarId::operator_cast_to_unsigned_int(&local_c0->dest);
              pmVar12 = std::
                        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_fffffffffffffb60,
                                     (key_type_conflict *)in_stack_fffffffffffffb58);
              std::__cxx11::string::operator=((string *)pmVar12,(string *)pbVar1);
            }
          }
          else {
            local_13c = 0;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                      (in_stack_fffffffffffffb30,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb28._M_current,(int *)in_stack_fffffffffffffb20);
            local_140 = mir::inst::VarId::operator_cast_to_unsigned_int(&local_c0->dest);
            std::
            map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                          *)in_stack_fffffffffffffb60,(key_type_conflict *)in_stack_fffffffffffffb58
                        );
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)in_stack_fffffffffffffb20,
                        (type)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                     *)0x1be100);
          }
        }
      }
      else if (iVar3 == 3) {
        local_190 = std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::get(&local_a8);
        local_198 = std::get<mir::inst::VarId,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)0x1be376);
        local_19c = mir::inst::VarId::operator_cast_to_unsigned_int(local_198);
        sVar9 = std::
                map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                ::count((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                         *)in_stack_fffffffffffffb30,
                        (key_type_conflict *)in_stack_fffffffffffffb28._M_current);
        if (sVar9 == 0) {
          local_284 = mir::inst::VarId::operator_cast_to_unsigned_int(local_198);
          sVar11 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::count((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffb30,
                           (key_type_conflict *)in_stack_fffffffffffffb28._M_current);
          if (sVar11 != 0) {
            local_298 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)std::
                           vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                           ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18))
            ;
            local_290 = __gnu_cxx::operator-
                                  ((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                    *)in_stack_fffffffffffffb20,
                                   (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18))
            ;
            local_2b0 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)std::
                           vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                           ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18))
            ;
            local_2a8 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)__gnu_cxx::
                           __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                           ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                        *)in_stack_fffffffffffffb28._M_current,
                                       (difference_type)in_stack_fffffffffffffb20);
            __gnu_cxx::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
            ::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                      ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            operator_new(0x38);
            mir::inst::VarId::VarId
                      ((VarId *)in_stack_fffffffffffffb20,
                       (VarId *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            in_stack_fffffffffffffb60 = local_20;
            mir::inst::VarId::operator_cast_to_unsigned_int(local_198);
            pmVar12 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)in_stack_fffffffffffffb60,
                                   (key_type_conflict *)in_stack_fffffffffffffb58);
            std::__cxx11::string::string(local_328,(string *)pmVar12);
            in_stack_fffffffffffffb58 =
                 (VarId *)bmir_variable_table::BmirVariableTable::getVarSingle
                                    (in_stack_fffffffffffffb20,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            std::
            __shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1be8c7);
            mir::inst::Value::Value((Value *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
            mir::inst::AssignInst::AssignInst
                      (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                       (Value *)in_stack_fffffffffffffb50._M_current);
            std::shared_ptr<mir::inst::AssignInst>::shared_ptr<mir::inst::AssignInst,void>
                      ((shared_ptr<mir::inst::AssignInst> *)in_stack_fffffffffffffb20,
                       (AssignInst *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            std::
            variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
            ::
            variant<std::shared_ptr<mir::inst::AssignInst>,void,void,std::shared_ptr<mir::inst::Inst>,void>
                      ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                        *)in_stack_fffffffffffffb20,
                       (shared_ptr<mir::inst::AssignInst> *)
                       CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            in_stack_fffffffffffffb50 =
                 std::
                 vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                 ::insert((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                           *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb28,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            std::
            variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                        *)0x1be963);
            std::shared_ptr<mir::inst::AssignInst>::~shared_ptr
                      ((shared_ptr<mir::inst::AssignInst> *)0x1be970);
            std::__cxx11::string::~string(local_328);
            in_stack_fffffffffffffb38._M_current = local_28;
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            __gnu_cxx::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
            ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                         *)in_stack_fffffffffffffb28._M_current,
                        (difference_type)in_stack_fffffffffffffb20);
            __gnu_cxx::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
            ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                         *)in_stack_fffffffffffffb28._M_current,
                        (difference_type)in_stack_fffffffffffffb20);
            __gnu_cxx::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
            ::
            __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                      ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::erase((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
          }
        }
        else {
          local_1b0 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)std::
                         vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_1a8 = __gnu_cxx::operator-
                                ((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                  *)in_stack_fffffffffffffb20,
                                 (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_1c8 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)std::
                         vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_1c0 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)__gnu_cxx::
                         __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                         ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                      *)in_stack_fffffffffffffb28._M_current,
                                     (difference_type)in_stack_fffffffffffffb20);
          __gnu_cxx::
          __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
          ::
          __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                    ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                      *)in_stack_fffffffffffffb20,
                     (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          operator_new(0x38);
          local_249 = 1;
          mir::inst::VarId::VarId
                    ((VarId *)in_stack_fffffffffffffb20,
                     (VarId *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_244 = mir::inst::VarId::operator_cast_to_unsigned_int(local_198);
          pmVar10 = std::
                    map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                  *)in_stack_fffffffffffffb60,
                                 (key_type_conflict *)in_stack_fffffffffffffb58);
          std::__cxx11::string::string(local_240,(string *)pmVar10);
          bmir_variable_table::BmirVariableTable::getVarArray
                    (in_stack_fffffffffffffb20,
                     (string *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          std::
          __shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1be511);
          local_248 = mir::inst::VarId::operator_cast_to_unsigned_int(local_198);
          std::
          map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          ::operator[]((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        *)in_stack_fffffffffffffb60,(key_type_conflict *)in_stack_fffffffffffffb58);
          std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20,
                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          mir::inst::Value::Value((Value *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
          mir::inst::AssignInst::AssignInst
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     (Value *)in_stack_fffffffffffffb50._M_current);
          local_249 = 0;
          std::shared_ptr<mir::inst::AssignInst>::shared_ptr<mir::inst::AssignInst,void>
                    ((shared_ptr<mir::inst::AssignInst> *)in_stack_fffffffffffffb20,
                     (AssignInst *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          std::
          variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
          ::
          variant<std::shared_ptr<mir::inst::AssignInst>,void,void,std::shared_ptr<mir::inst::Inst>,void>
                    ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)in_stack_fffffffffffffb20,
                     (shared_ptr<mir::inst::AssignInst> *)
                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_258 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)std::
                         vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         ::insert((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                   *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb28,
                                  (value_type *)
                                  CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          std::
          variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
          ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)0x1be62f);
          std::shared_ptr<mir::inst::AssignInst>::~shared_ptr
                    ((shared_ptr<mir::inst::AssignInst> *)0x1be63c);
          std::__cxx11::string::~string(local_240);
          local_278 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)std::
                         vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         ::begin((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_270 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)__gnu_cxx::
                         __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                         ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                      *)in_stack_fffffffffffffb28._M_current,
                                     (difference_type)in_stack_fffffffffffffb20);
          local_268 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)__gnu_cxx::
                         __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                         ::operator+((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                                      *)in_stack_fffffffffffffb28._M_current,
                                     (difference_type)in_stack_fffffffffffffb20);
          __gnu_cxx::
          __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>const*,std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>>
          ::
          __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>*>
                    ((__normal_iterator<const_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                      *)in_stack_fffffffffffffb20,
                     (__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
          local_280 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)std::
                         vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                         ::erase((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                  *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
        }
      }
      std::shared_ptr<mir::inst::Inst>::~shared_ptr((shared_ptr<mir::inst::Inst> *)0x1bebbb);
    }
    else {
      pvVar4 = __gnu_cxx::
               __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
               ::operator->(local_90);
      pcVar5 = std::
               variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
               ::index(pvVar4,(char *)__s,__c_00);
      if (pcVar5 == (char *)0x2) {
        std::
        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
        ::clear((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                 *)0x1bebf4);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
    ::operator++((__normal_iterator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_*,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>
                  *)in_stack_fffffffffffffb28._M_current,
                 (int)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  }
  std::
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x1bec21);
  std::
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~map((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
          *)0x1bec2e);
  return;
}

Assistant:

void optimize_functiom(
      std::string funcName, mir::inst::MirPackage& package,
      bmir_variable_table::BmirVariableTable& bmirVariableTable,
      std::vector<irGenerator::Instruction>& insts) {
    std::map<uint32_t, std::pair<std::string, uint32_t>> tmpVarId2Offset;
    std::map<uint32_t, std::string> tmpVarId2VarSingleName;
    for (auto instructionIter = insts.begin(); instructionIter != insts.end();
         instructionIter++) {
      if (instructionIter->index() == 0) {
        std::shared_ptr<mir::inst::Inst> mirInst =
            std::get<std::shared_ptr<mir::inst::Inst>>(*instructionIter);
        switch (mirInst->inst_kind()) {
          case mir::inst::InstKind::Ref: {
            mir::inst::RefInst* refInst = (mir::inst::RefInst*)mirInst.get();
            if (std::holds_alternative<std::string>(refInst->val)) {
              std::string& varName = std::get<std::string>(refInst->val);
              if (bmirVariableTable.hasNameKey(varName) &&
                  !bmirVariableTable.getVarArray(varName)->changed) {
                tmpVarId2Offset[refInst->dest] = {varName, 0};
              } else if (bmirVariableTable.hasVarSingle(varName) &&
                         !bmirVariableTable.getVarSingle(varName)->changed) {
                tmpVarId2VarSingleName[refInst->dest] = varName;
              }
            }
            break;
          }
          case mir::inst::InstKind::Load: {
            mir::inst::LoadInst* loadInst = (mir::inst::LoadInst*)mirInst.get();
            mir::inst::VarId& src = std::get<mir::inst::VarId>(loadInst->src);
            if (tmpVarId2Offset.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarArray(tmpVarId2Offset[src].first)
                                  ->initValues.at(tmpVarId2Offset[src].second /
                                                  mir::types::INT_SIZE)))));
              insts.erase(insts.begin() + index + 1);
            } else if (tmpVarId2VarSingleName.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarSingle(tmpVarId2VarSingleName[src])
                                  ->initValue))));
              insts.erase(insts.begin() + index + 1);
            }
            break;
          }
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*)mirInst.get();
            if (tmpVarId2Offset.count(opInst->dest) > 0) {
              if (std::holds_alternative<int32_t>(opInst->rhs)) {
                tmpVarId2Offset[opInst->dest].second +=
                    std::get<int32_t>(opInst->rhs);
              } else {
                tmpVarId2Offset.erase(opInst->dest);
              }
            }
            break;
          }
          default:
            break;
        }
      } else if (instructionIter->index() == 2) {
        tmpVarId2Offset.clear();
      }
    }
  }